

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<char,fmt::v5::basic_format_specs<char>>::hex_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          uint num_digits,string_view prefix,basic_format_specs<char> *spec,hex_writer f)

{
  ulong uVar1;
  alignment aVar2;
  int iVar3;
  ulong uVar4;
  ulong size;
  align_spec local_60;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<char,_fmt::v5::basic_format_specs<char>_>::hex_writer>
  local_50;
  
  local_50.prefix.size_ = prefix.size_;
  local_50.prefix.data_ = prefix.data_;
  uVar1 = num_digits + local_50.prefix.size_;
  local_50.fill = (char_type)(spec->super_align_spec).fill_;
  aVar2 = (spec->super_align_spec).align_;
  if (aVar2 == ALIGN_NUMERIC) {
    uVar4 = (ulong)(spec->super_align_spec).width_;
    size = uVar4;
    if (uVar4 < uVar1) {
      size = uVar1;
    }
    local_50.padding = 0;
    if (uVar1 <= uVar4) {
      local_50.padding = uVar4 - uVar1;
    }
    local_60.align_ = (spec->super_align_spec).align_;
    local_60.width_ = (spec->super_align_spec).width_;
    local_60.fill_ = (spec->super_align_spec).fill_;
  }
  else {
    iVar3 = spec->precision_;
    local_50.padding = 0;
    size = uVar1;
    if ((int)num_digits < iVar3) {
      size = (long)iVar3 + local_50.prefix.size_;
    }
    if ((int)num_digits < iVar3) {
      local_50.padding = (long)iVar3 - (ulong)num_digits;
      local_50.fill = '0';
    }
    local_60.align_ = (spec->super_align_spec).align_;
    local_60.width_ = (spec->super_align_spec).width_;
    local_60.fill_ = (spec->super_align_spec).fill_;
    if (aVar2 == ALIGN_DEFAULT) {
      local_60.align_ = ALIGN_RIGHT;
    }
  }
  local_50.f.self = f.self;
  local_50.f.num_digits = f.num_digits;
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<char,fmt::v5::basic_format_specs<char>>::hex_writer>>
            (this,size,&local_60,&local_50);
  return;
}

Assistant:

void write_int(unsigned num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + num_digits;
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision() > static_cast<int>(num_digits)) {
      size = prefix.size() + static_cast<std::size_t>(spec.precision());
      padding = static_cast<std::size_t>(spec.precision()) - num_digits;
      fill = '0';
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(size, as, padded_int_writer<F>{prefix, fill, padding, f});
  }